

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestApprovals.h
# Opt level: O3

void __thiscall
ApprovalTests::ApprovalTestsCppUTestPlugin::ApprovalTestsCppUTestPlugin
          (ApprovalTestsCppUTestPlugin *this)

{
  pointer *__ptr;
  SimpleString SStack_28;
  
  SimpleString::SimpleString(&SStack_28,"ApprovalTestsCppUTestPlugin");
  TestPlugin::TestPlugin(&this->super_TestPlugin,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  (this->super_TestPlugin)._vptr_TestPlugin =
       (_func_int **)&PTR__ApprovalTestsCppUTestPlugin_001686b0;
  (this->currentTest)._M_t.
  super___uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>._M_t
  .super__Tuple_impl<0UL,_ApprovalTests::TestName_*,_std::default_delete<ApprovalTests::TestName>_>.
  super__Head_base<0UL,_ApprovalTests::TestName_*,_false>._M_head_impl = (TestName *)0x0;
  MemoryLeakWarningPlugin::turnOffNewDeleteOverloads();
  return;
}

Assistant:

ApprovalTestsCppUTestPlugin() : TestPlugin("ApprovalTestsCppUTestPlugin")
        {
            // Turn off CppUTest's leak checks.
            // On some platforms, CppUTest's leak-checking reports leaks
            // in this code, because the way the platform's std::string manages life-times
            // of string storage is not compatible with the requirements of the
            // CppUTest leak-checks.
            MemoryLeakWarningPlugin::turnOffNewDeleteOverloads();
        }